

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<unsigned_int>(XmlWriter *this,string *name,uint *attribute)

{
  ulong uVar1;
  ostream *poVar2;
  uint *in_RDX;
  string *in_RSI;
  XmlWriter *in_RDI;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = stream(in_RDI);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,in_RSI);
    poVar2 = std::operator<<(poVar2,"=\"");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RDX);
    std::operator<<(poVar2,"\"");
  }
  return in_RDI;
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            if( !name.empty() )
                stream() << " " << name << "=\"" << attribute << "\"";
            return *this;
        }